

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

uint32_t Write<aiMatrix4x4t<float>>(aiMatrix4x4 *m)

{
  float *pfVar1;
  uint local_18;
  uint local_14;
  uint i2;
  uint i;
  aiMatrix4x4 *m_local;
  
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      pfVar1 = aiMatrix4x4t<float>::operator[](m,local_14);
      Write<float>(pfVar1 + local_18);
    }
  }
  return 0x40;
}

Assistant:

inline uint32_t Write<aiMatrix4x4>(const aiMatrix4x4& m)
{
	for (unsigned int i = 0; i < 4;++i) {
		for (unsigned int i2 = 0; i2 < 4;++i2) {
			Write<float>(m[i][i2]);
		}
	}
	return 64;
}